

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::vector<crnlib::unique_color_projection>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined1 *puVar1;
  long lVar2;
  unique_color_projection *pSrc;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      puVar1 = (undefined1 *)((long)pSrc_void + lVar2);
      *(undefined1 *)((long)pDst_void + lVar2) = *puVar1;
      *(undefined1 *)((long)pDst_void + lVar2 + 1) = puVar1[1];
      *(undefined1 *)((long)pDst_void + lVar2 + 2) = puVar1[2];
      *(undefined1 *)((long)pDst_void + lVar2 + 3) = puVar1[3];
      *(undefined4 *)((long)pDst_void + lVar2 + 4) = *(undefined4 *)(puVar1 + 4);
      *(undefined8 *)((long)pDst_void + lVar2 + 8) = *(undefined8 *)(puVar1 + 8);
      lVar2 = lVar2 + 0x10;
    } while (puVar1 + 0x10 != (undefined1 *)((ulong)num * 0x10 + (long)pSrc_void));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }